

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O3

void NOPN2_WriteBuffered(ym3438_t *chip,UINT8 port,UINT8 data)

{
  byte bVar1;
  Bit64u BVar2;
  Bit64u BVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  Bit32s buffer [2];
  Bit32s aBStack_38 [2];
  
  uVar4 = chip->writebuf_last;
  uVar5 = (ulong)uVar4;
  bVar1 = chip->writebuf[uVar5].port;
  if ((bVar1 & 4) != 0) {
    chip->write_data = (bVar1 & 2) << 7 | (ushort)chip->writebuf[uVar5].data;
    if ((bVar1 & 1) == 0) {
      chip->write_a = chip->write_a | 1;
    }
    else {
      chip->write_d = chip->write_d | 1;
    }
    chip->writebuf_cur = uVar4 + 1 & 0x7ff;
    BVar2 = chip->writebuf[uVar5].time;
    BVar3 = chip->writebuf_samplecnt;
    chip->writebuf_samplecnt = BVar2;
    if (BVar2 != BVar3) {
      lVar7 = BVar3 - BVar2;
      do {
        NOPN2_Clock(chip,aBStack_38);
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0);
      uVar4 = chip->writebuf_last;
      uVar5 = (ulong)uVar4;
    }
  }
  chip->writebuf[uVar5].port = port & 3 | 4;
  chip->writebuf[uVar5].data = data;
  uVar6 = chip->writebuf_lasttime + 0xf;
  if (uVar6 <= chip->writebuf_samplecnt) {
    uVar6 = chip->writebuf_samplecnt;
  }
  chip->writebuf[uVar5].time = uVar6;
  chip->writebuf_lasttime = uVar6;
  chip->writebuf_last = uVar4 + 1 & 0x7ff;
  return;
}

Assistant:

void NOPN2_WriteBuffered(ym3438_t *chip, UINT8 port, UINT8 data)
{
    Bit64u time1, time2;
    Bit32s buffer[2];
    Bit64u skip;

    if (chip->writebuf[chip->writebuf_last].port & 0x04)
    {
        NOPN2_Write(chip, chip->writebuf[chip->writebuf_last].port & 0X03,
                   chip->writebuf[chip->writebuf_last].data);

        chip->writebuf_cur = (chip->writebuf_last + 1) % NOPN_WRITEBUF_SIZE;
        skip = chip->writebuf[chip->writebuf_last].time - chip->writebuf_samplecnt;
        chip->writebuf_samplecnt = chip->writebuf[chip->writebuf_last].time;
        while (skip--)
        {
            NOPN2_Clock(chip, buffer);
        }
    }

    chip->writebuf[chip->writebuf_last].port = (port & 0x03) | 0x04;
    chip->writebuf[chip->writebuf_last].data = data;
    time1 = chip->writebuf_lasttime + NOPN_WRITEBUF_DELAY;
    time2 = chip->writebuf_samplecnt;

    if (time1 < time2)
    {
        time1 = time2;
    }

    chip->writebuf[chip->writebuf_last].time = time1;
    chip->writebuf_lasttime = time1;
    chip->writebuf_last = (chip->writebuf_last + 1) % NOPN_WRITEBUF_SIZE;
}